

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O3

void __thiscall
JsonTest::TestResult::addFailureInfo
          (TestResult *this,char *file,uint line,char *expr,uint nestingLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Failure failure;
  value_type local_88;
  
  paVar1 = &local_88.expr_.field_2;
  local_88.expr_._M_string_length = 0;
  local_88.expr_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_88.message_.field_2;
  local_88.message_._M_string_length = 0;
  local_88.message_.field_2._M_local_buf[0] = '\0';
  local_88.file_ = file;
  local_88.line_ = line;
  local_88.expr_._M_dataplus._M_p = (pointer)paVar1;
  local_88.message_._M_dataplus._M_p = (pointer)paVar2;
  if (expr != (char *)0x0) {
    strlen(expr);
    std::__cxx11::string::_M_replace((ulong)&local_88.expr_,0,(char *)0x0,(ulong)expr);
  }
  local_88.nestingLevel_ = nestingLevel;
  std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::push_back
            (&this->failures_,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.message_._M_dataplus._M_p != paVar2) {
    operator_delete(local_88.message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.expr_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.expr_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TestResult::addFailureInfo(const char* file,
                                unsigned int line,
                                const char* expr,
                                unsigned int nestingLevel) {
  Failure failure;
  failure.file_ = file;
  failure.line_ = line;
  if (expr) {
    failure.expr_ = expr;
  }
  failure.nestingLevel_ = nestingLevel;
  failures_.push_back(failure);
}